

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
PS2KeyboardAnalyzerSettings::LoadSettings(PS2KeyboardAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mClockChannel);
  SimpleArchive::operator>>(&text_archive,&this->mDataChannel);
  SimpleArchive::operator>>(&text_archive,&this->mDeviceType);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void PS2KeyboardAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mClockChannel;
    text_archive >> mDataChannel;
    text_archive >> mDeviceType;

    ClearChannels();
    AddChannel( mClockChannel, "PS/2 - Clock", true );
    AddChannel( mDataChannel, "PS/2 - Data", true );

    UpdateInterfacesFromSettings();
}